

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

size_t final_depth(size_t eliminations)

{
  ostream *poVar1;
  size_t i;
  size_t sVar2;
  
  sVar2 = 0;
  while( true ) {
    if (sVar2 == 0x20) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"too many eliminations");
      std::endl<char,std::char_traits<char>>(poVar1);
      return 0x1f;
    }
    if (eliminations - 1 >> ((byte)sVar2 & 0x3f) == 0) break;
    sVar2 = sVar2 + 1;
  }
  return sVar2;
}

Assistant:

size_t final_depth(size_t eliminations)
{
  eliminations--;
  for (size_t i = 0; i < 32; i++)
    if (eliminations >> i == 0)
      return i;
  cerr << "too many eliminations" << endl;
  return 31;
}